

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Parameters * __thiscall cnn::Model::add_parameters(Model *this,Dim *d,float scale)

{
  Parameters *this_00;
  value_type *in_RDI;
  float in_stack_00000014;
  Dim *in_stack_00000018;
  Parameters *in_stack_00000020;
  Parameters *p;
  Parameters *__x;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *in_stack_ffffffffffffffd0;
  
  this_00 = (Parameters *)operator_new(0xc0);
  Parameters::Parameters(in_stack_00000020,in_stack_00000018,in_stack_00000014);
  __x = this_00;
  std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::push_back
            ((vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)this_00,in_RDI
            );
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::push_back
            (in_stack_ffffffffffffffd0,(value_type *)__x);
  return this_00;
}

Assistant:

Parameters* Model::add_parameters(const Dim& d, float scale) {
  Parameters* p = new Parameters(d, scale);
  all_params.push_back(p);
  params.push_back(p);
  return p;
}